

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant.cpp
# Opt level: O1

UMatchDegree __thiscall
icu_63::Quantifier::matches
          (Quantifier *this,Replaceable *text,int32_t *offset,int32_t limit,UBool incremental)

{
  int32_t iVar1;
  int iVar2;
  char cVar3;
  int iVar4;
  UMatchDegree UVar5;
  undefined4 extraout_var;
  uint uVar6;
  
  iVar1 = *offset;
  uVar6 = 0;
  do {
    if (this->maxCount <= uVar6) goto LAB_00266c56;
    iVar2 = *offset;
    iVar4 = (*(this->matcher->super_UObject)._vptr_UObject[4])();
    iVar4 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x10))
                      ((long *)CONCAT44(extraout_var,iVar4),text,offset,limit,(int)incremental);
    if (iVar4 == 2) {
      uVar6 = uVar6 + 1;
      cVar3 = (iVar2 == *offset) * '\x03';
    }
    else {
      cVar3 = (iVar4 != 1) * '\x02' + '\x01';
      if (incremental == '\0') {
        cVar3 = '\x03';
      }
    }
  } while (cVar3 == '\0');
  if (cVar3 == '\x03') {
LAB_00266c56:
    if (((incremental == '\0') || (UVar5 = U_PARTIAL_MATCH, *offset != limit)) &&
       (UVar5 = U_MATCH, uVar6 < this->minCount)) {
      *offset = iVar1;
      UVar5 = U_MISMATCH;
    }
  }
  else {
    UVar5 = U_PARTIAL_MATCH;
  }
  return UVar5;
}

Assistant:

UMatchDegree Quantifier::matches(const Replaceable& text,
                                 int32_t& offset,
                                 int32_t limit,
                                 UBool incremental) {
    int32_t start = offset;
    uint32_t count = 0;
    while (count < maxCount) {
        int32_t pos = offset;
        UMatchDegree m = matcher->toMatcher()->matches(text, offset, limit, incremental);
        if (m == U_MATCH) {
            ++count;
            if (pos == offset) {
                // If offset has not moved we have a zero-width match.
                // Don't keep matching it infinitely.
                break;
            }
        } else if (incremental && m == U_PARTIAL_MATCH) {
            return U_PARTIAL_MATCH;
        } else {
            break;
        }
    }
    if (incremental && offset == limit) {
        return U_PARTIAL_MATCH;
    }
    if (count >= minCount) {
        return U_MATCH;
    }
    offset = start;
    return U_MISMATCH;
}